

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv2_gears.c
# Opt level: O1

void glesv2_gears_draw(gears_t_conflict1 *gears,float view_tz,float view_rx,float view_ry,
                      float model_rz)

{
  float *a;
  float blue [4];
  float green [4];
  float red [4];
  float local_88 [27];
  undefined4 local_1c;
  
  local_88[8] = 0.8;
  local_88[9] = 0.1;
  local_88[10] = 0.0;
  local_88[0xb] = 1.0;
  local_88[4] = 0.0;
  local_88[5] = 0.8;
  local_88[6] = 0.2;
  local_88[7] = 1.0;
  local_88[0] = 0.2;
  local_88[1] = 0.2;
  local_88[2] = 1.0;
  local_88[3] = 1.0;
  if (gears != (gears_t_conflict1 *)0x0) {
    (*gears->glClear)(0x4100);
    a = gears->View;
    gears->View[0] = 1.0;
    gears->View[1] = 0.0;
    gears->View[2] = 0.0;
    gears->View[3] = 0.0;
    gears->View[4] = 0.0;
    gears->View[5] = 1.0;
    gears->View[6] = 0.0;
    gears->View[7] = 0.0;
    gears->View[8] = 0.0;
    gears->View[9] = 0.0;
    gears->View[10] = 1.0;
    gears->View[0xb] = 0.0;
    gears->View[0xc] = 0.0;
    gears->View[0xd] = 0.0;
    gears->View[0xe] = 0.0;
    gears->View[0xf] = 1.0;
    local_88[0xc] = 1.0;
    local_88[0xd] = 0.0;
    local_88[0xe] = 0.0;
    local_88[0xf] = 0.0;
    local_88[0x10] = 0.0;
    local_88[0x11] = 1.0;
    local_88[0x12] = 0.0;
    local_88[0x13] = 0.0;
    local_88[0x14] = 0.0;
    local_88[0x15] = 0.0;
    local_88[0x16] = 1.0;
    local_88[0x17] = 0.0;
    local_88[0x18] = 0.0;
    local_88[0x19] = 0.0;
    local_1c = 0x3f800000;
    local_88[0x1a] = view_tz;
    multiply(a,local_88 + 0xc);
    rotate(a,view_rx,1.0,0.0,0.0);
    rotate(a,view_ry,0.0,1.0,0.0);
    draw_gear(gears,0,-3.0,-2.0,model_rz,local_88 + 8);
    draw_gear(gears,1,3.1,-2.0,model_rz * -2.0 + -9.0,local_88 + 4);
    draw_gear(gears,2,-3.1,4.2,model_rz * -2.0 + -25.0,local_88);
  }
  return;
}

Assistant:

static void glesv2_gears_draw(gears_t *gears, float view_tz, float view_rx, float view_ry, float model_rz)
{
  const float red[4] = { 0.8, 0.1, 0.0, 1.0 };
  const float green[4] = { 0.0, 0.8, 0.2, 1.0 };
  const float blue[4] = { 0.2, 0.2, 1.0, 1.0 };

  if (!gears) {
    return;
  }

  gears->glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

  identity(gears->View);
  translate(gears->View, 0, 0, view_tz);
  rotate(gears->View, view_rx, 1, 0, 0);
  rotate(gears->View, view_ry, 0, 1, 0);

  draw_gear(gears, GEAR0, -3.0, -2.0,      model_rz     , red);
  draw_gear(gears, GEAR1,  3.1, -2.0, -2 * model_rz - 9 , green);
  draw_gear(gears, GEAR2, -3.1,  4.2, -2 * model_rz - 25, blue);
}